

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestFailure_StringsEqualNoCaseFailureWithText_TestShell::createTest
          (TEST_TestFailure_StringsEqualNoCaseFailureWithText_TestShell *this)

{
  TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test *this_00;
  TEST_TestFailure_StringsEqualNoCaseFailureWithText_TestShell *this_local;
  
  this_00 = (TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0xfd);
  TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test::
  TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, StringsEqualNoCaseFailureWithText)
{
    StringEqualNoCaseFailure f(test, failFileName, failLineNumber, "ABC", "abd", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <ABC>\n"
                  "\tbut was  <abd>\n"
                  "\tdifference starts at position 2 at: <        abd         >\n"
                  "\t                                               ^", f);
}